

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Alloc.h
# Opt level: O2

void __thiscall
Glucose::RegionAllocator<unsigned_int>::capacity
          (RegionAllocator<unsigned_int> *this,uint32_t min_cap)

{
  uint uVar1;
  undefined8 uVar2;
  uint *puVar3;
  uint uVar4;
  
  uVar1 = this->cap;
  uVar4 = uVar1;
  if (uVar1 < min_cap) {
    while (uVar4 < min_cap) {
      uVar4 = uVar4 + ((uVar4 >> 3) + (uVar4 >> 1) & 0xfffffffe) + 2;
      this->cap = uVar4;
      if (uVar4 <= uVar1) {
        uVar2 = __cxa_allocate_exception(1);
        __cxa_throw(uVar2,&OutOfMemoryException::typeinfo,0);
      }
    }
    puVar3 = (uint *)xrealloc(this->memory,(ulong)uVar4 << 2);
    this->memory = puVar3;
  }
  return;
}

Assistant:

void RegionAllocator<T>::capacity(uint32_t min_cap)
{
    if (cap >= min_cap) return;
    uint32_t prev_cap = cap;
    while (cap < min_cap){
        // NOTE: Multiply by a factor (13/8) without causing overflow, then add 2 and make the
        // result even by clearing the least significant bit. The resulting sequence of capacities
        // is carefully chosen to hit a maximum capacity that is close to the '2^32-1' limit when
        // using 'uint32_t' as indices so that as much as possible of this space can be used.
        uint32_t delta = ((cap >> 1) + (cap >> 3) + 2) & ~1;
        cap += delta;

        if (cap <= prev_cap)
            throw OutOfMemoryException();
    }
    //printf(" .. (%p) cap = %u\n", this, cap);

    assert(cap > 0);
    memory = (T*)xrealloc(memory, sizeof(T)*cap);
}